

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::read_sos_marker(jpeg_decoder *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  
  iVar13 = this->m_bits_left;
  uVar12 = this->m_bit_buf;
  this->m_bits_left = iVar13 + -0x10;
  if (iVar13 < 0x11) {
    this->m_bit_buf = uVar12 << ((byte)iVar13 & 0x1f);
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar15 = this->m_tem_flag;
      this->m_tem_flag = uVar15 ^ 1;
      uVar9 = 0xd9;
      if (uVar15 == 0) {
        uVar9 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      bVar1 = *pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      uVar9 = (uint)bVar1;
    }
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar8 = this->m_tem_flag;
      this->m_tem_flag = uVar8 ^ 1;
      uVar15 = 0xd9;
      if (uVar8 == 0) {
        uVar15 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      uVar15 = (uint)*pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
    }
    this->m_bit_buf =
         (uVar9 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar15) <<
         (-(char)this->m_bits_left & 0x1fU);
    this->m_bits_left = this->m_bits_left + 0x10;
  }
  else {
    this->m_bit_buf = uVar12 << 0x10;
  }
  iVar13 = this->m_bits_left;
  uVar9 = this->m_bit_buf;
  uVar15 = uVar9 >> 0x18;
  this->m_bits_left = iVar13 + -8;
  if (iVar13 < 9) {
    this->m_bit_buf = uVar9 << ((byte)iVar13 & 0x1f);
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar6 = this->m_tem_flag;
      this->m_tem_flag = uVar6 ^ 1;
      uVar8 = 0xd9;
      if (uVar6 == 0) {
        uVar8 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      bVar1 = *pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      uVar8 = (uint)bVar1;
    }
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar7 = this->m_tem_flag;
      this->m_tem_flag = uVar7 ^ 1;
      uVar6 = 0xd9;
      if (uVar7 == 0) {
        uVar6 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      uVar6 = (uint)*pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
    }
    this->m_bit_buf =
         (uVar8 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar6) <<
         (-(char)this->m_bits_left & 0x1fU);
    this->m_bits_left = this->m_bits_left + 0x10;
  }
  else {
    this->m_bit_buf = uVar9 << 8;
  }
  this->m_comps_in_scan = uVar15;
  if ((uVar15 - 5 < 0xfffffffc) || (uVar12 = uVar12 >> 0x10, uVar12 != uVar15 * 2 + 6)) {
    stop_decoding(this,JPGD_BAD_SOS_LENGTH);
  }
  if (0xffffff < uVar9) {
    uVar12 = uVar12 + uVar15 * -2;
    uVar16 = 0;
    do {
      iVar13 = this->m_bits_left;
      uVar9 = this->m_bit_buf;
      this->m_bits_left = iVar13 + -8;
      if (iVar13 < 9) {
        this->m_bit_buf = uVar9 << ((byte)iVar13 & 0x1f);
        if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
          uVar6 = this->m_tem_flag;
          this->m_tem_flag = uVar6 ^ 1;
          uVar8 = 0xd9;
          if (uVar6 == 0) {
            uVar8 = 0xff;
          }
        }
        else {
          pbVar4 = this->m_pIn_buf_ofs;
          this->m_pIn_buf_ofs = pbVar4 + 1;
          bVar1 = *pbVar4;
          this->m_in_buf_left = this->m_in_buf_left + -1;
          uVar8 = (uint)bVar1;
        }
        if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
          uVar7 = this->m_tem_flag;
          this->m_tem_flag = uVar7 ^ 1;
          uVar6 = 0xd9;
          if (uVar7 == 0) {
            uVar6 = 0xff;
          }
        }
        else {
          pbVar4 = this->m_pIn_buf_ofs;
          this->m_pIn_buf_ofs = pbVar4 + 1;
          uVar6 = (uint)*pbVar4;
          this->m_in_buf_left = this->m_in_buf_left + -1;
        }
        this->m_bit_buf =
             (uVar8 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar6) <<
             (-(char)this->m_bits_left & 0x1fU);
        this->m_bits_left = this->m_bits_left + 0x10;
      }
      else {
        this->m_bit_buf = uVar9 << 8;
      }
      iVar13 = this->m_bits_left;
      uVar8 = this->m_bit_buf;
      this->m_bits_left = iVar13 + -8;
      if (iVar13 < 9) {
        this->m_bit_buf = uVar8 << ((byte)iVar13 & 0x1f);
        if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
          uVar7 = this->m_tem_flag;
          this->m_tem_flag = uVar7 ^ 1;
          uVar6 = 0xd9;
          if (uVar7 == 0) {
            uVar6 = 0xff;
          }
        }
        else {
          pbVar4 = this->m_pIn_buf_ofs;
          this->m_pIn_buf_ofs = pbVar4 + 1;
          bVar1 = *pbVar4;
          this->m_in_buf_left = this->m_in_buf_left + -1;
          uVar6 = (uint)bVar1;
        }
        if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
          uVar2 = this->m_tem_flag;
          this->m_tem_flag = uVar2 ^ 1;
          uVar7 = 0xd9;
          if (uVar2 == 0) {
            uVar7 = 0xff;
          }
        }
        else {
          pbVar4 = this->m_pIn_buf_ofs;
          this->m_pIn_buf_ofs = pbVar4 + 1;
          uVar7 = (uint)*pbVar4;
          this->m_in_buf_left = this->m_in_buf_left + -1;
        }
        this->m_bit_buf =
             (uVar6 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar7) <<
             (-(char)this->m_bits_left & 0x1fU);
        this->m_bits_left = this->m_bits_left + 0x10;
      }
      else {
        this->m_bit_buf = uVar8 << 8;
      }
      uVar10 = (ulong)this->m_comps_in_frame;
      bVar17 = 0 < (long)uVar10;
      if ((long)uVar10 < 1) {
LAB_0011fc8c:
        stop_decoding(this,JPGD_BAD_SOS_COMP_ID);
      }
      if (uVar9 >> 0x18 == this->m_comp_ident[0]) {
        uVar11 = 0;
      }
      else {
        uVar14 = 0;
        do {
          if (uVar10 - 1 == uVar14) goto LAB_0011fc8c;
          uVar11 = uVar14 + 1;
          lVar5 = uVar14 + 1;
          uVar14 = uVar11;
        } while (uVar9 >> 0x18 != this->m_comp_ident[lVar5]);
        bVar17 = uVar11 < uVar10;
      }
      if (!bVar17) goto LAB_0011fc8c;
      this->m_comp_list[uVar16] = (int)uVar11;
      this->m_comp_dc_tab[uVar11 & 0xffffffff] = uVar8 >> 0x1c;
      this->m_comp_ac_tab[uVar11 & 0xffffffff] = (uVar8 >> 0x18 & 0xf) + 4;
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar15);
  }
  iVar13 = this->m_bits_left;
  uVar9 = this->m_bit_buf;
  this->m_bits_left = iVar13 + -8;
  if (iVar13 < 9) {
    this->m_bit_buf = uVar9 << ((byte)iVar13 & 0x1f);
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar8 = this->m_tem_flag;
      this->m_tem_flag = uVar8 ^ 1;
      uVar15 = 0xd9;
      if (uVar8 == 0) {
        uVar15 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      bVar1 = *pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      uVar15 = (uint)bVar1;
    }
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar6 = this->m_tem_flag;
      this->m_tem_flag = uVar6 ^ 1;
      uVar8 = 0xd9;
      if (uVar6 == 0) {
        uVar8 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      uVar8 = (uint)*pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
    }
    this->m_bit_buf =
         (uVar15 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar8) <<
         (-(char)this->m_bits_left & 0x1fU);
    this->m_bits_left = this->m_bits_left + 0x10;
  }
  else {
    this->m_bit_buf = uVar9 << 8;
  }
  this->m_spectral_start = uVar9 >> 0x18;
  iVar13 = this->m_bits_left;
  uVar9 = this->m_bit_buf;
  this->m_bits_left = iVar13 + -8;
  if (iVar13 < 9) {
    this->m_bit_buf = uVar9 << ((byte)iVar13 & 0x1f);
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar8 = this->m_tem_flag;
      this->m_tem_flag = uVar8 ^ 1;
      uVar15 = 0xd9;
      if (uVar8 == 0) {
        uVar15 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      bVar1 = *pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      uVar15 = (uint)bVar1;
    }
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar6 = this->m_tem_flag;
      this->m_tem_flag = uVar6 ^ 1;
      uVar8 = 0xd9;
      if (uVar6 == 0) {
        uVar8 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      uVar8 = (uint)*pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
    }
    this->m_bit_buf =
         (uVar15 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar8) <<
         (-(char)this->m_bits_left & 0x1fU);
    this->m_bits_left = this->m_bits_left + 0x10;
  }
  else {
    this->m_bit_buf = uVar9 << 8;
  }
  this->m_spectral_end = uVar9 >> 0x18;
  iVar13 = this->m_bits_left;
  uVar9 = this->m_bit_buf;
  this->m_bits_left = iVar13 + -4;
  if (iVar13 < 5) {
    this->m_bit_buf = uVar9 << ((byte)iVar13 & 0x1f);
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar8 = this->m_tem_flag;
      this->m_tem_flag = uVar8 ^ 1;
      uVar15 = 0xd9;
      if (uVar8 == 0) {
        uVar15 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      bVar1 = *pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      uVar15 = (uint)bVar1;
    }
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar6 = this->m_tem_flag;
      this->m_tem_flag = uVar6 ^ 1;
      uVar8 = 0xd9;
      if (uVar6 == 0) {
        uVar8 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      uVar8 = (uint)*pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
    }
    this->m_bit_buf =
         (uVar15 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar8) <<
         (-(char)this->m_bits_left & 0x1fU);
    this->m_bits_left = this->m_bits_left + 0x10;
  }
  else {
    this->m_bit_buf = uVar9 << 4;
  }
  this->m_successive_high = uVar9 >> 0x1c;
  iVar13 = this->m_bits_left;
  uVar9 = this->m_bit_buf;
  this->m_bits_left = iVar13 + -4;
  if (iVar13 < 5) {
    this->m_bit_buf = uVar9 << ((byte)iVar13 & 0x1f);
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar8 = this->m_tem_flag;
      this->m_tem_flag = uVar8 ^ 1;
      uVar15 = 0xd9;
      if (uVar8 == 0) {
        uVar15 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      bVar1 = *pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
      uVar15 = (uint)bVar1;
    }
    if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
      uVar6 = this->m_tem_flag;
      this->m_tem_flag = uVar6 ^ 1;
      uVar8 = 0xd9;
      if (uVar6 == 0) {
        uVar8 = 0xff;
      }
    }
    else {
      pbVar4 = this->m_pIn_buf_ofs;
      this->m_pIn_buf_ofs = pbVar4 + 1;
      uVar8 = (uint)*pbVar4;
      this->m_in_buf_left = this->m_in_buf_left + -1;
    }
    this->m_bit_buf =
         (uVar15 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar8) <<
         (-(char)this->m_bits_left & 0x1fU);
    this->m_bits_left = this->m_bits_left + 0x10;
  }
  else {
    this->m_bit_buf = uVar9 << 4;
  }
  this->m_successive_low = uVar9 >> 0x1c;
  if (this->m_progressive_flag == 0) {
    this->m_spectral_start = 0;
    this->m_spectral_end = 0x3f;
  }
  for (iVar13 = uVar12 - 6; iVar13 != 0; iVar13 = iVar13 + -1) {
    iVar3 = this->m_bits_left;
    this->m_bits_left = iVar3 + -8;
    if (iVar3 < 9) {
      this->m_bit_buf = this->m_bit_buf << ((byte)iVar3 & 0x1f);
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar9 = this->m_tem_flag;
        this->m_tem_flag = uVar9 ^ 1;
        uVar12 = 0xd9;
        if (uVar9 == 0) {
          uVar12 = 0xff;
        }
      }
      else {
        pbVar4 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar4 + 1;
        uVar12 = (uint)*pbVar4;
        this->m_in_buf_left = this->m_in_buf_left + -1;
      }
      if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
        uVar15 = this->m_tem_flag;
        this->m_tem_flag = uVar15 ^ 1;
        uVar9 = 0xd9;
        if (uVar15 == 0) {
          uVar9 = 0xff;
        }
      }
      else {
        pbVar4 = this->m_pIn_buf_ofs;
        this->m_pIn_buf_ofs = pbVar4 + 1;
        uVar9 = (uint)*pbVar4;
        this->m_in_buf_left = this->m_in_buf_left + -1;
      }
      this->m_bit_buf =
           (uVar12 << 8 | (uint)*(ushort *)((long)&this->m_bit_buf + 2) << 0x10 | uVar9) <<
           (-(char)this->m_bits_left & 0x1fU);
      this->m_bits_left = this->m_bits_left + 0x10;
    }
    else {
      this->m_bit_buf = this->m_bit_buf << 8;
    }
  }
  return;
}

Assistant:

void jpeg_decoder::read_sos_marker() {
  uint num_left;
  int i, ci, n, c, cc;

  num_left = get_bits(16);

  n = get_bits(8);

  m_comps_in_scan = n;

  num_left -= 3;

  if ((num_left != (uint)(n * 2 + 3)) || (n < 1) || (n > JPGD_MAX_COMPS_IN_SCAN))
    stop_decoding(JPGD_BAD_SOS_LENGTH);

  for (i = 0; i < n; i++) {
    cc = get_bits(8);
    c = get_bits(8);
    num_left -= 2;

    for (ci = 0; ci < m_comps_in_frame; ci++)
      if (cc == m_comp_ident[ci])
        break;

    if (ci >= m_comps_in_frame)
      stop_decoding(JPGD_BAD_SOS_COMP_ID);

    m_comp_list[i] = ci;
    m_comp_dc_tab[ci] = (c >> 4) & 15;
    m_comp_ac_tab[ci] = (c & 15) + (JPGD_MAX_HUFF_TABLES >> 1);
  }

  m_spectral_start = get_bits(8);
  m_spectral_end = get_bits(8);
  m_successive_high = get_bits(4);
  m_successive_low = get_bits(4);

  if (!m_progressive_flag) {
    m_spectral_start = 0;
    m_spectral_end = 63;
  }

  num_left -= 3;

  while (num_left) /* read past whatever is num_left */
  {
    get_bits(8);
    num_left--;
  }
}